

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

bool Hex::Hexdumper<unsigned_int>::data_is_equal<std::pair<unsigned_int_const*,unsigned_int_const*>>
               (pair<const_unsigned_int_*,_const_unsigned_int_*> *a,
               pair<const_unsigned_int_*,_const_unsigned_int_*> *b)

{
  bool bVar1;
  pair<const_unsigned_int_*,_const_unsigned_int_*> *b_local;
  pair<const_unsigned_int_*,_const_unsigned_int_*> *a_local;
  
  bVar1 = std::operator==(a,b);
  if (bVar1) {
    a_local._7_1_ = true;
  }
  else if ((long)a->second - (long)a->first >> 2 == (long)b->second - (long)b->first >> 2) {
    a_local._7_1_ = std::equal<unsigned_int_const*,unsigned_int_const*>(a->first,a->second,b->first)
    ;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

static bool data_is_equal(const PAIR& a, const PAIR& b)
    {
        if (a==b)
            return true;
        if (a.second-a.first != b.second-b.first)
            return false;
        return std::equal(a.first, a.second, b.first);
    }